

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_compute_norm(gauden_t *g)

{
  float32 ***pppfVar1;
  float32 fVar2;
  uint local_1c;
  uint local_18;
  uint32 k;
  uint32 j;
  uint32 i;
  gauden_t *g_local;
  
  if (g->norm != (float32 ***)0x0) {
    ckd_free_3d(g->norm);
  }
  pppfVar1 = (float32 ***)
             __ckd_calloc_3d__((ulong)g->n_mgau,(ulong)g->n_feat,(ulong)g->n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x179);
  g->norm = pppfVar1;
  for (k = 0; k < g->n_mgau; k = k + 1) {
    for (local_18 = 0; local_18 < g->n_feat; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < g->n_density; local_1c = local_1c + 1) {
        if (g->fullvar == (vector_t ****)0x0) {
          fVar2 = diag_norm(g->var[k][local_18][local_1c],g->veclen[local_18]);
          g->norm[k][local_18][local_1c] = fVar2;
        }
        else {
          fVar2 = full_norm(g->fullvar[k][local_18][local_1c],g->veclen[local_18]);
          g->norm[k][local_18][local_1c] = fVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_compute_norm(gauden_t *g)
{
    uint32 i, j, k;

    if (g->norm) {
	ckd_free_3d((void ***)g->norm);
    }

    g->norm  = (float32 ***) ckd_calloc_3d(g->n_mgau, g->n_feat, g->n_density,
					  sizeof(float32));

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		if (g->fullvar)
		    g->norm[i][j][k] = full_norm(g->fullvar[i][j][k], g->veclen[j]);
		else
		    g->norm[i][j][k] = diag_norm(g->var[i][j][k], g->veclen[j]);
	    }
	}
    }
}